

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.h
# Opt level: O0

uint32_t MercuryJson::_parse_eight_digits(char *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_DIL;
  undefined1 in_register_00000039;
  undefined6 in_register_0000003a;
  __m128i mul_1_10;
  __m128i ascii0;
  undefined4 local_98;
  __m128i t4;
  __m128i t3;
  __m128i t2;
  __m128i t1;
  __m128i in;
  __m128i mul_1_10000;
  __m128i mul_1_100;
  
  auVar1 = vpinsrb_avx(ZEXT116(0x30),0x30,1);
  auVar1 = vpinsrb_avx(auVar1,0x30,2);
  auVar1 = vpinsrb_avx(auVar1,0x30,3);
  auVar1 = vpinsrb_avx(auVar1,0x30,4);
  auVar1 = vpinsrb_avx(auVar1,0x30,5);
  auVar1 = vpinsrb_avx(auVar1,0x30,6);
  auVar1 = vpinsrb_avx(auVar1,0x30,7);
  auVar1 = vpinsrb_avx(auVar1,0x30,8);
  auVar1 = vpinsrb_avx(auVar1,0x30,9);
  auVar1 = vpinsrb_avx(auVar1,0x30,10);
  auVar1 = vpinsrb_avx(auVar1,0x30,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x30,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x30,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x30,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x30,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(10),1,1);
  auVar2 = vpinsrb_avx(auVar2,10,2);
  auVar2 = vpinsrb_avx(auVar2,1,3);
  auVar2 = vpinsrb_avx(auVar2,10,4);
  auVar2 = vpinsrb_avx(auVar2,1,5);
  auVar2 = vpinsrb_avx(auVar2,10,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,10,8);
  auVar2 = vpinsrb_avx(auVar2,1,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,10,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,10,0xe);
  auVar2 = vpinsrb_avx(auVar2,1,0xf);
  auVar3 = vpinsrw_avx(ZEXT216(100),1,1);
  auVar3 = vpinsrw_avx(auVar3,100,2);
  auVar3 = vpinsrw_avx(auVar3,1,3);
  auVar3 = vpinsrw_avx(auVar3,100,4);
  auVar3 = vpinsrw_avx(auVar3,1,5);
  auVar3 = vpinsrw_avx(auVar3,100,6);
  auVar3 = vpinsrw_avx(auVar3,1,7);
  auVar4 = vpinsrw_avx(ZEXT216(10000),1,1);
  auVar4 = vpinsrw_avx(auVar4,10000,2);
  auVar4 = vpinsrw_avx(auVar4,1,3);
  auVar4 = vpinsrw_avx(auVar4,10000,4);
  auVar4 = vpinsrw_avx(auVar4,1,5);
  auVar4 = vpinsrw_avx(auVar4,10000,6);
  auVar4 = vpinsrw_avx(auVar4,1,7);
  auVar1 = vpsubb_avx(*(undefined1 (*) [16])
                       CONCAT62(in_register_0000003a,CONCAT11(in_register_00000039,in_DIL)),auVar1);
  auVar1 = vpmaddubsw_avx(auVar1,auVar2);
  auVar1 = vpmaddwd_avx(auVar1,auVar3);
  auVar1 = vpackusdw_avx(auVar1,auVar1);
  auVar1 = vpmaddwd_avx(auVar1,auVar4);
  local_98 = auVar1._0_4_;
  return local_98;
}

Assistant:

inline uint32_t _parse_eight_digits(const char *s) {
        const __m128i ascii0 = _mm_set1_epi8('0');
        const __m128i mul_1_10 = _mm_setr_epi8(10, 1, 10, 1, 10, 1, 10, 1, 10, 1, 10, 1, 10, 1, 10, 1);
        const __m128i mul_1_100 = _mm_setr_epi16(100, 1, 100, 1, 100, 1, 100, 1);
        const __m128i mul_1_10000 = _mm_setr_epi16(10000, 1, 10000, 1, 10000, 1, 10000, 1);
        __m128i in = _mm_sub_epi8(_mm_loadu_si128(reinterpret_cast<const __m128i *>(s)), ascii0);
        __m128i t1 = _mm_maddubs_epi16(in, mul_1_10);
        __m128i t2 = _mm_madd_epi16(t1, mul_1_100);
        __m128i t3 = _mm_packus_epi32(t2, t2);
        __m128i t4 = _mm_madd_epi16(t3, mul_1_10000);
        return _mm_cvtsi128_si32(t4);
    }